

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFUnit.h
# Opt level: O1

size_t __thiscall llvm::DWARFUnit::getDebugInfoSize(DWARFUnit *this)

{
  DwarfFormat DVar1;
  long lVar2;
  
  DVar1 = (this->Header).FormParams.Format;
  lVar2 = 4;
  if (DVar1 != DWARF32) {
    if (DVar1 != DWARF64) {
      llvm_unreachable_internal
                ("Invalid Format value",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/third_party/llvm-project/include/llvm/BinaryFormat/Dwarf.h"
                 ,0x23e);
    }
    lVar2 = 0xc;
  }
  return (lVar2 + (this->Header).Length) - (ulong)(this->Header).Size;
}

Assistant:

uint64_t getLength() const { return Length; }